

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *target,string_view param_2,string_view value)

{
  std::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)target,&value);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<std::string>& target, string_view,
                                     string_view value) {
    target = value;
    return {};
}